

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O0

void __thiscall
TEST_MockSupport_c_FailWillCrashIfEnabled_TestShell::
~TEST_MockSupport_c_FailWillCrashIfEnabled_TestShell
          (TEST_MockSupport_c_FailWillCrashIfEnabled_TestShell *this)

{
  TEST_MockSupport_c_FailWillCrashIfEnabled_TestShell *this_local;
  
  ~TEST_MockSupport_c_FailWillCrashIfEnabled_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockSupport_c, FailWillCrashIfEnabled)
{
    cpputestHasCrashed = false;
    TestTestingFixture fixture;
    UtestShell::setCrashOnFail();
    UtestShell::setCrashMethod(crashMethod);

    fixture.setTestFunction(failedCallToMockC);

    fixture.runAllTests();

    CHECK(cpputestHasCrashed);
    LONGS_EQUAL(1, fixture.getFailureCount());

    UtestShell::restoreDefaultTestTerminator();
    UtestShell::resetCrashMethod();
}